

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O2

void __thiscall
sf2cute::SFInstrumentZone::set_sample(SFInstrumentZone *this,weak_ptr<sf2cute::SFSample> *sample)

{
  SoundFont *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((((this->parent_instrument_ != (SFInstrument *)0x0) &&
       (this_00 = this->parent_instrument_->parent_file_, this_00 != (SoundFont *)0x0)) &&
      (p_Var1 = (sample->super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     && (p_Var1->_M_use_count != 0)) {
    std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,sample)
    ;
    SoundFont::AddSample(this_00,(shared_ptr<sf2cute::SFSample> *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  std::__weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>,
             &sample->super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void SFInstrumentZone::set_sample(std::weak_ptr<SFSample> sample) {
  if (has_parent_file() && !sample.expired()) {
    parent_file().AddSample(sample.lock());
  }
  sample_ = std::move(sample);
}